

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Bond_p __thiscall indigox::Molecule::NewBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  bool bVar1;
  Bond_p *bnd_00;
  element_type *this_00;
  MolVertex v;
  element_type *b_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_bool>
  pVar3;
  Bond_p BVar4;
  MolEdgeBool eb;
  Bond_p *bnd;
  enable_shared_from_this<indigox::Molecule> *in_stack_fffffffffffffdd8;
  Atom *in_stack_fffffffffffffde0;
  Atom *this_01;
  Atom *in_stack_fffffffffffffde8;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  *in_stack_fffffffffffffe00;
  Atom_p *in_stack_fffffffffffffe40;
  Atom_p *in_stack_fffffffffffffe48;
  Bond *in_stack_fffffffffffffe50;
  uid_t *u;
  MolecularGraph *this_02;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffed9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffee0;
  Molecule *in_stack_fffffffffffffee8;
  MolecularGraph local_d0;
  
  local_d0._175_1_ = 0;
  std::shared_ptr<indigox::Bond>::shared_ptr((shared_ptr<indigox::Bond> *)0x111467);
  std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x111474);
  Atom::GetMolecule(in_stack_fffffffffffffde8);
  std::enable_shared_from_this<indigox::Molecule>::shared_from_this(in_stack_fffffffffffffdd8);
  bVar1 = std::operator!=((shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffde0,
                          (shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffdd8);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x1114ca);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x1114d7);
  _Var2._M_pi = extraout_RDX;
  if (!bVar1) {
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x111548);
    Atom::GetMolecule(in_stack_fffffffffffffde8);
    std::enable_shared_from_this<indigox::Molecule>::shared_from_this(in_stack_fffffffffffffdd8);
    bVar1 = std::operator!=((shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffde0,
                            (shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffdd8);
    std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x11159e);
    std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x1115ab);
    _Var2._M_pi = extraout_RDX_00;
    if (!bVar1) {
      std::shared_ptr<indigox::Atom>::shared_ptr
                ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffde0,
                 (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffdd8);
      std::shared_ptr<indigox::Atom>::shared_ptr
                ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffde0,
                 (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffdd8);
      GetBond(in_stack_fffffffffffffee8,(Atom_p *)in_stack_fffffffffffffee0._M_pi,
              (Atom_p *)CONCAT71(in_stack_fffffffffffffed9,in_stack_fffffffffffffed8));
      std::shared_ptr<indigox::Bond>::operator=
                ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffde0,
                 (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffdd8);
      std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x111679);
      std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111686);
      std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111693);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
      _Var2._M_pi = extraout_RDX_01;
      if (!bVar1) {
        operator_new(0x58);
        u = &local_d0.super__MolGraph.next_edge_id_;
        std::shared_ptr<indigox::Atom>::shared_ptr
                  ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffde0,
                   (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffdd8);
        this_02 = &local_d0;
        std::shared_ptr<indigox::Atom>::shared_ptr
                  ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffde0,
                   (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffdd8);
        Bond::Bond(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::reset<indigox::Bond>
                  (in_stack_fffffffffffffdf0,(Bond *)in_stack_fffffffffffffde8);
        std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111749);
        std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x111756);
        std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>::
        emplace_back<std::shared_ptr<indigox::Bond>&>
                  ((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                    *)in_stack_fffffffffffffdf0,
                   (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffde8);
        bnd_00 = (Bond_p *)(in_RSI + 0xa8);
        this_00 = std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x111791);
        v = (MolVertex)Bond::GetIndex(this_00);
        std::
        unordered_map<unsigned_long,std::weak_ptr<indigox::Bond>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>>
        ::emplace<unsigned_long,std::shared_ptr<indigox::Bond>&>
                  ((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
                    *)in_stack_fffffffffffffdf0,(unsigned_long *)in_stack_fffffffffffffde8,
                   (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffde0);
        std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1117fe);
        std::
        map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
        ::at(in_stack_fffffffffffffe00,
             (key_type *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
        std::
        map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
        ::at(in_stack_fffffffffffffe00,
             (key_type *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
        std::shared_ptr<indigox::Bond>::shared_ptr
                  ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffde0,
                   (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffdd8);
        MolecularGraph::AddEdge(this_02,u,v,bnd_00);
        std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x1118ad);
        pVar3 = std::
                map<std::shared_ptr<indigox::Bond>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,std::less<std::shared_ptr<indigox::Bond>>,std::allocator<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>>
                ::
                emplace<std::shared_ptr<indigox::Bond>&,boost::detail::edge_desc_impl<boost::undirected_tag,void*>&>
                          ((map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
                            *)in_stack_fffffffffffffdf0,
                           (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffde8,
                           (edge_desc_impl<boost::undirected_tag,_void_*> *)
                           in_stack_fffffffffffffde0);
        local_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar3.first._M_node;
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x111901);
        std::shared_ptr<indigox::Bond>::shared_ptr
                  ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffde0,
                   (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffdd8);
        Atom::AddBond(in_stack_fffffffffffffde0,(Bond_p *)in_stack_fffffffffffffdd8);
        std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x11193e);
        b_00 = std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11194b);
        this_01 = (Atom *)&stack0xfffffffffffffeb0;
        std::shared_ptr<indigox::Bond>::shared_ptr
                  ((shared_ptr<indigox::Bond> *)this_01,(shared_ptr<indigox::Bond> *)b_00);
        Atom::AddBond(this_01,(Bond_p *)b_00);
        std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x111986);
        *(undefined1 *)(in_RSI + 0x158) = 1;
        _Var2._M_pi = extraout_RDX_02;
      }
    }
  }
  BVar4.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  BVar4.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Bond_p)BVar4.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::NewBond(Atom_p a, Atom_p b) {
  /// @todo Logging for fail reasons.
  Bond_p bnd = Bond_p();
  if (a->GetMolecule() != shared_from_this()) return bnd;
  if (b->GetMolecule() != shared_from_this()) return bnd;
  bnd = GetBond(a, b);
  if (!bnd) {
    bnd.reset(new Bond(a, b));
    bonds_.emplace_back(bnd);
    idx_to_bond_.emplace(bnd->GetIndex(), bnd);
    MolEdgeBool eb = graph_->AddEdge(atom_to_vertex_.at(a),
                                     atom_to_vertex_.at(b), bnd);
    bond_to_edge_.emplace(bnd, eb.first);
    a->AddBond(bnd);
    b->AddBond(bnd);
    modified_ = true;
  } // else Log that bond already exists.
  return bnd;
}